

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O1

void CB_EXPLORE::print_update_cb_explore(vw *all,bool is_test,example *ec,stringstream *pred_string)

{
  bool holdout_set_off;
  shared_data *psVar1;
  size_t current_pass;
  stringstream label_string;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  psVar1 = all->sd;
  if ((((double)psVar1->dump_interval <=
        psVar1->weighted_labeled_examples + psVar1->weighted_unlabeled_examples) &&
      (all->quiet == false)) && (all->bfgs == false)) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    if (is_test) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," unknown",8);
    }
    else {
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    }
    psVar1 = all->sd;
    current_pass = all->current_pass;
    holdout_set_off = all->holdout_set_off;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    shared_data::print_update
              (psVar1,holdout_set_off,current_pass,&local_1d8,&local_1f8,ec->num_features,
               all->progress_add,all->progress_arg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return;
}

Assistant:

void print_update_cb_explore(vw& all, bool is_test, example& ec, stringstream& pred_string)
{
  if (all.sd->weighted_examples() >= all.sd->dump_interval && !all.quiet && !all.bfgs)
  {
    stringstream label_string;
    if (is_test)
      label_string << " unknown";
    else
      label_string << ec.l.cb.costs[0].action;
    all.sd->print_update(all.holdout_set_off, all.current_pass, label_string.str(), pred_string.str(), ec.num_features,
        all.progress_add, all.progress_arg);
  }
}